

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void nlohmann::detail::dtoa_impl::grisu2<double>
               (char *buf,int *len,int *decimal_exponent,double value)

{
  undefined8 uVar1;
  uint uVar2;
  diyfp w_00;
  diyfp M_plus;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  diyfp dVar7;
  diyfp dVar8;
  diyfp dVar9;
  diyfp c_minus_k;
  boundaries w;
  undefined4 uStack_bc;
  undefined4 uStack_ac;
  diyfp local_a8;
  diyfp local_98;
  diyfp local_80;
  diyfp local_70;
  uint64_t local_60;
  int iStack_58;
  undefined4 uStack_54;
  uint64_t local_50;
  int local_48;
  uint64_t local_40;
  int iStack_38;
  undefined4 uStack_34;
  
  compute_boundaries<double>(value);
  local_98.f = local_60;
  local_98.e = iStack_58;
  local_98._12_4_ = uStack_54;
  local_a8.f = local_40;
  local_a8.e = iStack_38;
  local_a8._12_4_ = uStack_34;
  uVar3 = local_a8._8_8_;
  local_70.f = local_50;
  local_a8.e = (int)_iStack_38;
  local_70.e = local_48;
  iVar5 = (-0x3d - local_a8.e) * 0x13441;
  iVar6 = iVar5 + 0x3ffff;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  uVar2 = (uint)(0 < -0x3d - local_a8.e);
  iVar5 = uVar2 + (iVar6 >> 0x12) + 0x133;
  iVar6 = uVar2 + (iVar6 >> 0x12) + 0x13a;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  lVar4 = (long)(iVar6 >> 3) * 0x10;
  local_80.f = *(uint64_t *)(get_cached_power_for_binary_exponent(int)::kCachedPowers + lVar4);
  uVar1 = *(undefined8 *)(get_cached_power_for_binary_exponent(int)::kCachedPowers + lVar4 + 8);
  local_80.e = (int)uVar1;
  local_a8._8_8_ = uVar3;
  dVar7 = diyfp::mul(&local_98,&local_80);
  dVar8 = diyfp::mul(&local_70,&local_80);
  dVar9 = diyfp::mul(&local_a8,&local_80);
  *decimal_exponent = -(int)((ulong)uVar1 >> 0x20);
  M_plus._12_4_ = uStack_bc;
  M_plus.e = dVar9.e;
  w_00._12_4_ = uStack_ac;
  w_00.e = dVar7.e;
  w_00.f = dVar7.f;
  M_plus.f = dVar9.f - 1;
  dVar7.e = dVar8.e;
  dVar7.f = dVar8.f + 1;
  dVar7._12_4_ = 0;
  grisu2_digit_gen(buf,len,decimal_exponent,dVar7,w_00,M_plus);
  return;
}

Assistant:

JSON_HEDLEY_NON_NULL(1)
void grisu2(char* buf, int& len, int& decimal_exponent, FloatType value)
{
    static_assert(diyfp::kPrecision >= std::numeric_limits<FloatType>::digits + 3,
                  "internal error: not enough precision");

    JSON_ASSERT(std::isfinite(value));
    JSON_ASSERT(value > 0);

    // If the neighbors (and boundaries) of 'value' are always computed for double-precision
    // numbers, all float's can be recovered using strtod (and strtof). However, the resulting
    // decimal representations are not exactly "short".
    //
    // The documentation for 'std::to_chars' (https://en.cppreference.com/w/cpp/utility/to_chars)
    // says "value is converted to a string as if by std::sprintf in the default ("C") locale"
    // and since sprintf promotes floats to doubles, I think this is exactly what 'std::to_chars'
    // does.
    // On the other hand, the documentation for 'std::to_chars' requires that "parsing the
    // representation using the corresponding std::from_chars function recovers value exactly". That
    // indicates that single precision floating-point numbers should be recovered using
    // 'std::strtof'.
    //
    // NB: If the neighbors are computed for single-precision numbers, there is a single float
    //     (7.0385307e-26f) which can't be recovered using strtod. The resulting double precision
    //     value is off by 1 ulp.
#if 0
    const boundaries w = compute_boundaries(static_cast<double>(value));
#else
    const boundaries w = compute_boundaries(value);
#endif

    grisu2(buf, len, decimal_exponent, w.minus, w.w, w.plus);
}